

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int pem_get_iv(uchar *s,uchar *iv,size_t iv_len)

{
  int iVar1;
  byte local_48;
  size_t k;
  size_t j;
  size_t i;
  size_t iv_len_local;
  uchar *iv_local;
  uchar *s_local;
  
  memset(iv,0,iv_len);
  j = 0;
  iv_local = s;
  do {
    if (iv_len << 1 <= j) {
      return 0;
    }
    if ((*iv_local < 0x30) || (0x39 < *iv_local)) {
      if ((*iv_local < 0x41) || (0x46 < *iv_local)) {
        if ((*iv_local < 0x61) || (0x66 < *iv_local)) {
          return -0x1200;
        }
        iVar1 = *iv_local - 0x57;
      }
      else {
        iVar1 = *iv_local - 0x37;
      }
    }
    else {
      iVar1 = *iv_local - 0x30;
    }
    k = (size_t)iVar1;
    if ((j & 1) == 0) {
      local_48 = (byte)(k << 4);
    }
    else {
      local_48 = (byte)iVar1;
    }
    iv[j >> 1] = iv[j >> 1] | local_48;
    j = j + 1;
    iv_local = iv_local + 1;
  } while( true );
}

Assistant:

static int pem_get_iv( const unsigned char *s, unsigned char *iv,
                       size_t iv_len )
{
    size_t i, j, k;

    memset( iv, 0, iv_len );

    for( i = 0; i < iv_len * 2; i++, s++ )
    {
        if( *s >= '0' && *s <= '9' ) j = *s - '0'; else
        if( *s >= 'A' && *s <= 'F' ) j = *s - '7'; else
        if( *s >= 'a' && *s <= 'f' ) j = *s - 'W'; else
            return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

        k = ( ( i & 1 ) != 0 ) ? j : j << 4;

        iv[i >> 1] = (unsigned char)( iv[i >> 1] | k );
    }

    return( 0 );
}